

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult __thiscall
cmCMakePresetsGraph::ReadJSONFile
          (cmCMakePresetsGraph *this,string *filename,RootType rootType,ReadReason readReason,
          vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          *inProgressFiles,File **file,string *errMsg)

{
  bool bVar1;
  byte bVar2;
  ReadFileResult RVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  pointer pFVar8;
  uint *this_00;
  pointer *this_01;
  pointer *this_02;
  OutputOptions *pOVar9;
  pointer *this_03;
  pointer *this_04;
  ulong uVar10;
  pointer *this_05;
  reference pbVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_bool>
  pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_bool>
  pVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_bool>
  pVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_bool>
  pVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_bool>
  pVar16;
  undefined1 local_1f28 [8];
  string cmakePresetsFilename;
  cmAlphaNum local_1ed8;
  string local_1ea8;
  undefined1 local_1e88 [8];
  string directory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> include;
  iterator __end1_6;
  iterator __begin1_6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_6;
  anon_class_24_3_d2e26b0a includeFile;
  undefined1 local_1df0 [8];
  PresetPair<cmCMakePresetsGraph::WorkflowPreset> presetPair_4;
  WorkflowPreset *preset_4;
  iterator __end1_5;
  iterator __begin1_5;
  vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
  *__range1_5;
  undefined1 local_1bc0 [8];
  PresetPair<cmCMakePresetsGraph::PackagePreset> presetPair_3;
  PackagePreset *preset_3;
  iterator __end1_4;
  iterator __begin1_4;
  vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
  *__range1_4;
  undefined1 local_1760 [8];
  PresetPair<cmCMakePresetsGraph::TestPreset> presetPair_2;
  TestPreset *preset_2;
  iterator __end1_3;
  iterator __begin1_3;
  vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
  *__range1_3;
  undefined1 local_1000 [8];
  PresetPair<cmCMakePresetsGraph::BuildPreset> presetPair_1;
  BuildPreset *preset_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
  *__range1_2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
  local_cf8;
  _Base_ptr local_8f0;
  byte local_8e8;
  undefined1 local_8d8 [8];
  PresetPair<cmCMakePresetsGraph::ConfigurePreset> presetPair;
  ConfigurePreset *preset;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
  *__range1_1;
  unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_> local_4c0;
  __single_object filePtr;
  CMakeVersion *required;
  uint currentPatch;
  uint currentMinor;
  uint currentMajor;
  RootPresets presets;
  undefined1 local_3f8 [4];
  int v;
  cmAlphaNum local_3c8;
  string local_398;
  undefined1 local_378 [8];
  CharReaderBuilder builder;
  Value root;
  cmAlphaNum local_318;
  cmAlphaNum local_2e8;
  string local_2b8;
  long local_288;
  ifstream fin;
  __normal_iterator<cmCMakePresetsGraph::File_**,_std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>_>
  local_80;
  File **local_78;
  __normal_iterator<cmCMakePresetsGraph::File_**,_std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>_>
  local_70;
  __normal_iterator<cmCMakePresetsGraph::File_**,_std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>_>
  local_68;
  __normal_iterator<cmCMakePresetsGraph::File_**,_std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>_>
  fileIt;
  unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_> *f;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  *__range1;
  ReadFileResult result;
  File **file_local;
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
  *inProgressFiles_local;
  ReadReason readReason_local;
  RootType rootType_local;
  string *filename_local;
  cmCMakePresetsGraph *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
           ::begin(&this->Files);
  f = (unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_> *)
      std::
      vector<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
      ::end(&this->Files);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>_>
                                     *)&f), bVar1) {
    fileIt._M_current =
         (File **)__gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>_>
                  ::operator*(&__end1);
    pFVar8 = std::
             unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
             ::operator->((unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                           *)fileIt._M_current);
    bVar1 = cmsys::SystemTools::SameFile(filename,&pFVar8->Filename);
    if (bVar1) {
      pFVar8 = std::
               unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
               ::get((unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                      *)fileIt._M_current);
      *file = pFVar8;
      local_70._M_current =
           (File **)std::
                    vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                    ::begin(inProgressFiles);
      local_78 = (File **)std::
                          vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                          ::end(inProgressFiles);
      local_68 = std::
                 find<__gnu_cxx::__normal_iterator<cmCMakePresetsGraph::File**,std::vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>>,cmCMakePresetsGraph::File*>
                           (local_70,(__normal_iterator<cmCMakePresetsGraph::File_**,_std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>_>
                                      )local_78,file);
      local_80._M_current =
           (File **)std::
                    vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                    ::end(inProgressFiles);
      bVar1 = __gnu_cxx::operator!=(&local_68,&local_80);
      if (!bVar1) {
        return READ_OK;
      }
      return CYCLIC_INCLUDE;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_288,pcVar7,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_288 + *(long *)(local_288 + -0x18)));
  if ((bVar2 & 1) != 0) {
    cmAlphaNum::cmAlphaNum(&local_2e8,filename);
    cmAlphaNum::cmAlphaNum(&local_318,": Failed to read file\n");
    cmStrCat<std::__cxx11::string>(&local_2b8,&local_2e8,&local_318,errMsg);
    std::__cxx11::string::operator=((string *)errMsg,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    this_local._4_4_ = FILE_NOT_FOUND;
    goto LAB_002080be;
  }
  cmsys::FStream::ReadBOM((istream *)&local_288);
  Json::Value::Value((Value *)&builder.settings_.limit_,nullValue);
  Json::CharReaderBuilder::CharReaderBuilder((CharReaderBuilder *)local_378);
  Json::CharReaderBuilder::strictMode((Value *)&builder);
  bVar1 = Json::parseFromStream
                    ((Factory *)local_378,(IStream *)&local_288,(Value *)&builder.settings_.limit_,
                     errMsg);
  if (bVar1) {
    presets.Include.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<int>::operator()
                      ((Object<int> *)(anonymous_namespace)::RootVersionHelper,
                       (int *)((long)&presets.Include.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       (Value *)&builder.settings_.limit_);
    if (RVar3 == READ_OK) {
      if ((presets.Include.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 1) ||
         (6 < presets.Include.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
        this_local._4_4_ = UNRECOGNIZED_VERSION;
        RVar3 = this_local._4_4_;
      }
      else if ((presets.Include.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 2) &&
              ((bVar1 = Json::Value::isMember((Value *)&builder.settings_.limit_,"buildPresets"),
               bVar1 || (bVar1 = Json::Value::isMember
                                           ((Value *)&builder.settings_.limit_,"testPresets"), bVar1
                        )))) {
        this_local._4_4_ = BUILD_TEST_PRESETS_UNSUPPORTED;
        RVar3 = this_local._4_4_;
      }
      else if ((presets.Include.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 6) &&
              (bVar1 = Json::Value::isMember((Value *)&builder.settings_.limit_,"packagePresets"),
              bVar1)) {
        this_local._4_4_ = PACKAGE_PRESETS_UNSUPPORTED;
        RVar3 = this_local._4_4_;
      }
      else if ((presets.Include.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 6) &&
              (bVar1 = Json::Value::isMember((Value *)&builder.settings_.limit_,"workflowPresets"),
              bVar1)) {
        this_local._4_4_ = WORKFLOW_PRESETS_UNSUPPORTED;
        RVar3 = this_local._4_4_;
      }
      else if ((presets.Include.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 4) &&
              (bVar1 = Json::Value::isMember((Value *)&builder.settings_.limit_,"include"), bVar1))
      {
        this_local._4_4_ = INCLUDE_UNSUPPORTED;
        RVar3 = this_local._4_4_;
      }
      else {
        anon_unknown.dwarf_15151e::RootPresets::RootPresets((RootPresets *)&currentMinor);
        RVar3 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                Object<(anonymous_namespace)::RootPresets>::operator()
                          ((Object<(anonymous_namespace)::RootPresets> *)
                           (anonymous_namespace)::RootPresetsHelper,(RootPresets *)&currentMinor,
                           (Value *)&builder.settings_.limit_);
        if (RVar3 == READ_OK) {
          uVar4 = cmVersion::GetMajorVersion();
          uVar5 = cmVersion::GetMinorVersion();
          uVar6 = cmVersion::GetPatchVersion();
          filePtr._M_t.
          super___uniq_ptr_impl<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCMakePresetsGraph::File_*,_std::default_delete<cmCMakePresetsGraph::File>_>
          .super__Head_base<0UL,_cmCMakePresetsGraph::File_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>,_true,_true>
                )&currentMinor;
          if ((uVar4 < currentMinor) ||
             ((currentMinor == uVar4 &&
              ((uVar5 < currentMajor ||
               ((currentMajor == uVar5 && (uVar6 < presets.CMakeMinimumRequired.Major)))))))) {
            this_local._4_4_ = UNRECOGNIZED_CMAKE_VERSION;
            RVar3 = this_local._4_4_;
          }
          else {
            std::make_unique<cmCMakePresetsGraph::File>();
            pFVar8 = std::
                     unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                     ::get(&local_4c0);
            *file = pFVar8;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>>
                        *)&this->Files,&local_4c0);
            std::vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>::
            emplace_back<cmCMakePresetsGraph::File*&>
                      ((vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>
                        *)inProgressFiles,file);
            std::__cxx11::string::operator=((string *)*file,(string *)filename);
            (*file)->Version =
                 presets.Include.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            std::
            unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
            ::insert(&(*file)->ReachableFiles,file);
            this_00 = &presets.CMakeMinimumRequired.Patch;
            __end1_1 = std::
                       vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                       ::begin((vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                                *)this_00);
            preset = (ConfigurePreset *)
                     std::
                     vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                     ::end((vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                            *)this_00);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end1_1,
                                      (__normal_iterator<cmCMakePresetsGraph::ConfigurePreset_*,_std::vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>_>
                                       *)&preset), bVar1) {
              presetPair.Expanded.
              super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._496_8_ =
                   __gnu_cxx::
                   __normal_iterator<cmCMakePresetsGraph::ConfigurePreset_*,_std::vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>_>
                   ::operator*(&__end1_1);
              (((reference)
               presetPair.Expanded.
               super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>.
               super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._496_8_)->
              super_Preset).OriginFile = *file;
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) != 0) {
                std::__cxx11::string::operator+=((string *)errMsg,"\\n\\t");
                std::__cxx11::string::operator+=((string *)errMsg,(string *)filename);
                this_local._4_4_ = INVALID_PRESET;
                goto LAB_00208052;
              }
              PresetPair<cmCMakePresetsGraph::ConfigurePreset>::PresetPair
                        ((PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)local_8d8);
              ConfigurePreset::operator=
                        ((ConfigurePreset *)local_8d8,
                         (ConfigurePreset *)
                         presetPair.Expanded.
                         super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>.
                         _M_payload.
                         super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
                         .super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._496_8_
                        );
              std::optional<cmCMakePresetsGraph::ConfigurePreset>::operator=
                        ((optional<cmCMakePresetsGraph::ConfigurePreset> *)
                         &presetPair.Unexpanded.DebugTryCompile);
              std::
              make_pair<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>&>
                        (&local_cf8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (presetPair.Expanded.
                          super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>.
                          _M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>.
                          _496_8_ + 8),(PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)local_8d8
                        );
              pVar12 = std::
                       map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                       ::
                       emplace<std::pair<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>
                                 ((map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                                   *)&this->ConfigurePresets,&local_cf8);
              local_8f0 = (_Base_ptr)pVar12.first._M_node;
              local_8e8 = pVar12.second;
              bVar2 = local_8e8 ^ 0xff;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
              ::~pair(&local_cf8);
              if ((bVar2 & 1) == 0) {
                if ((presets.Include.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3) &&
                   (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                  this_local._4_4_ = INSTALL_PREFIX_UNSUPPORTED;
                  bVar1 = true;
                }
                else if ((presets.Include.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3) &&
                        (bVar1 = std::__shared_ptr::operator_cast_to_bool
                                           ((__shared_ptr *)
                                            (presetPair.Expanded.
                                             super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>
                                             ._496_8_ + 0x90)), bVar1)) {
                  this_local._4_4_ = CONDITION_UNSUPPORTED;
                  bVar1 = true;
                }
                else if ((presets.Include.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3) &&
                        (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                  this_local._4_4_ = TOOLCHAIN_FILE_UNSUPPORTED;
                  bVar1 = true;
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&this->ConfigurePresetOrder,
                              (value_type *)
                              (presetPair.Expanded.
                               super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>
                               ._M_payload.
                               super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
                               .super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>.
                               _496_8_ + 8));
                  bVar1 = false;
                }
              }
              else {
                this_local._4_4_ = DUPLICATE_PRESETS;
                bVar1 = true;
              }
              PresetPair<cmCMakePresetsGraph::ConfigurePreset>::~PresetPair
                        ((PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)local_8d8);
              if (bVar1) goto LAB_00208052;
              __gnu_cxx::
              __normal_iterator<cmCMakePresetsGraph::ConfigurePreset_*,_std::vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>_>
              ::operator++(&__end1_1);
            }
            this_01 = &presets.ConfigurePresets.
                       super__Vector_base<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end1_2 = std::
                       vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                       ::begin((vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                                *)this_01);
            preset_1 = (BuildPreset *)
                       std::
                       vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                       ::end((vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                              *)this_01);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end1_2,
                                      (__normal_iterator<cmCMakePresetsGraph::BuildPreset_*,_std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_>
                                       *)&preset_1), bVar1) {
              presetPair_1.Expanded.
              super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._360_8_ =
                   __gnu_cxx::
                   __normal_iterator<cmCMakePresetsGraph::BuildPreset_*,_std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_>
                   ::operator*(&__end1_2);
              (((reference)
               presetPair_1.Expanded.
               super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
               super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._360_8_)->super_Preset
              ).OriginFile = *file;
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) != 0) {
                std::__cxx11::string::operator+=((string *)errMsg,"\\n\\t");
                std::__cxx11::string::operator+=((string *)errMsg,(string *)filename);
                this_local._4_4_ = INVALID_PRESET;
                goto LAB_00208052;
              }
              PresetPair<cmCMakePresetsGraph::BuildPreset>::PresetPair
                        ((PresetPair<cmCMakePresetsGraph::BuildPreset> *)local_1000);
              BuildPreset::operator=
                        ((BuildPreset *)local_1000,
                         (BuildPreset *)
                         presetPair_1.Expanded.
                         super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>.
                         _M_payload.
                         super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>
                         .super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._360_8_);
              std::optional<cmCMakePresetsGraph::BuildPreset>::operator=
                        ((optional<cmCMakePresetsGraph::BuildPreset> *)
                         &presetPair_1.Unexpanded.ResolvePackageReferences);
              pVar13 = std::
                       map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>>
                       ::
                       emplace<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>&>
                                 ((map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>>
                                   *)&this->BuildPresets,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(presetPair_1.Expanded.
                                      super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>
                                      ._360_8_ + 8),
                                  (PresetPair<cmCMakePresetsGraph::BuildPreset> *)local_1000);
              if (((pVar13.second ^ 0xffU) & 1) == 0) {
                if ((presets.Include.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3) &&
                   (bVar1 = std::__shared_ptr::operator_cast_to_bool
                                      ((__shared_ptr *)
                                       (presetPair_1.Expanded.
                                        super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>
                                        ._360_8_ + 0x90)), bVar1)) {
                  this_local._4_4_ = CONDITION_UNSUPPORTED;
                  bVar1 = true;
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&this->BuildPresetOrder,
                              (value_type *)
                              (presetPair_1.Expanded.
                               super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>.
                               _M_payload.
                               super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>
                               .super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>.
                               _360_8_ + 8));
                  bVar1 = false;
                }
              }
              else {
                this_local._4_4_ = DUPLICATE_PRESETS;
                bVar1 = true;
              }
              PresetPair<cmCMakePresetsGraph::BuildPreset>::~PresetPair
                        ((PresetPair<cmCMakePresetsGraph::BuildPreset> *)local_1000);
              if (bVar1) goto LAB_00208052;
              __gnu_cxx::
              __normal_iterator<cmCMakePresetsGraph::BuildPreset_*,_std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_>
              ::operator++(&__end1_2);
            }
            this_02 = &presets.BuildPresets.
                       super__Vector_base<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end1_3 = std::
                       vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
                       ::begin((vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
                                *)this_02);
            preset_2 = (TestPreset *)
                       std::
                       vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
                       ::end((vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
                              *)this_02);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end1_3,
                                      (__normal_iterator<cmCMakePresetsGraph::TestPreset_*,_std::vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>_>
                                       *)&preset_2), bVar1) {
              presetPair_2.Expanded.
              super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._904_8_ =
                   __gnu_cxx::
                   __normal_iterator<cmCMakePresetsGraph::TestPreset_*,_std::vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>_>
                   ::operator*(&__end1_3);
              (((reference)
               presetPair_2.Expanded.
               super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
               super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._904_8_)->super_Preset)
              .OriginFile = *file;
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) != 0) {
                this_local._4_4_ = INVALID_PRESET;
                goto LAB_00208052;
              }
              PresetPair<cmCMakePresetsGraph::TestPreset>::PresetPair
                        ((PresetPair<cmCMakePresetsGraph::TestPreset> *)local_1760);
              TestPreset::operator=
                        ((TestPreset *)local_1760,
                         (TestPreset *)
                         presetPair_2.Expanded.
                         super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>.
                         _M_payload.
                         super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                         .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._904_8_);
              std::optional<cmCMakePresetsGraph::TestPreset>::operator=
                        ((optional<cmCMakePresetsGraph::TestPreset> *)
                         ((long)&presetPair_2.Unexpanded.Execution.
                                 super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                         + 0x60));
              pVar14 = std::
                       map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>>
                       ::
                       emplace<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>&>
                                 ((map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>>
                                   *)&this->TestPresets,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(presetPair_2.Expanded.
                                      super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                                      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>
                                      ._904_8_ + 8),
                                  (PresetPair<cmCMakePresetsGraph::TestPreset> *)local_1760);
              if (((pVar14.second ^ 0xffU) & 1) == 0) {
                if ((presets.Include.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3) &&
                   (bVar1 = std::__shared_ptr::operator_cast_to_bool
                                      ((__shared_ptr *)
                                       (presetPair_2.Expanded.
                                        super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>
                                        ._904_8_ + 0x90)), bVar1)) {
                  this_local._4_4_ = CONDITION_UNSUPPORTED;
                  bVar1 = true;
                }
                else {
                  if ((presets.Include.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 5) &&
                     (bVar1 = std::optional::operator_cast_to_bool
                                        ((optional *)
                                         (presetPair_2.Expanded.
                                          super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>
                                          ._904_8_ + 0x138)), bVar1)) {
                    pOVar9 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::
                             operator->((optional<cmCMakePresetsGraph::TestPreset::OutputOptions> *)
                                        (presetPair_2.Expanded.
                                         super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>
                                         ._904_8_ + 0x138));
                    bVar1 = std::optional::operator_cast_to_bool
                                      ((optional *)&pOVar9->TestOutputTruncation);
                    if (bVar1) {
                      this_local._4_4_ = TEST_OUTPUT_TRUNCATION_UNSUPPORTED;
                      bVar1 = true;
                      goto LAB_00207961;
                    }
                  }
                  if ((presets.Include.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 6) &&
                     (bVar1 = std::optional::operator_cast_to_bool
                                        ((optional *)
                                         (presetPair_2.Expanded.
                                          super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>
                                          ._904_8_ + 0x138)), bVar1)) {
                    std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                              ((optional<cmCMakePresetsGraph::TestPreset::OutputOptions> *)
                               (presetPair_2.Expanded.
                                super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>.
                                _M_payload.
                                super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                                .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                                _904_8_ + 0x138));
                    uVar10 = std::__cxx11::string::empty();
                    if ((uVar10 & 1) == 0) {
                      this_local._4_4_ = CTEST_JUNIT_UNSUPPORTED;
                      bVar1 = true;
                      goto LAB_00207961;
                    }
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&this->TestPresetOrder,
                              (value_type *)
                              (presetPair_2.Expanded.
                               super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>.
                               _M_payload.
                               super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                               .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                               _904_8_ + 8));
                  bVar1 = false;
                }
              }
              else {
                this_local._4_4_ = DUPLICATE_PRESETS;
                bVar1 = true;
              }
LAB_00207961:
              PresetPair<cmCMakePresetsGraph::TestPreset>::~PresetPair
                        ((PresetPair<cmCMakePresetsGraph::TestPreset> *)local_1760);
              if (bVar1) goto LAB_00208052;
              __gnu_cxx::
              __normal_iterator<cmCMakePresetsGraph::TestPreset_*,_std::vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>_>
              ::operator++(&__end1_3);
            }
            this_03 = &presets.TestPresets.
                       super__Vector_base<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end1_4 = std::
                       vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                       ::begin((vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                                *)this_03);
            preset_3 = (PackagePreset *)
                       std::
                       vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                       ::end((vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                              *)this_03);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end1_4,
                                      (__normal_iterator<cmCMakePresetsGraph::PackagePreset_*,_std::vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_>
                                       *)&preset_3), bVar1) {
              presetPair_3.Expanded.
              super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._520_8_ =
                   __gnu_cxx::
                   __normal_iterator<cmCMakePresetsGraph::PackagePreset_*,_std::vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_>
                   ::operator*(&__end1_4);
              (((reference)
               presetPair_3.Expanded.
               super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
               super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._520_8_)->
              super_Preset).OriginFile = *file;
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) != 0) {
                this_local._4_4_ = INVALID_PRESET;
                goto LAB_00208052;
              }
              PresetPair<cmCMakePresetsGraph::PackagePreset>::PresetPair
                        ((PresetPair<cmCMakePresetsGraph::PackagePreset> *)local_1bc0);
              PackagePreset::operator=
                        ((PackagePreset *)local_1bc0,
                         (PackagePreset *)
                         presetPair_3.Expanded.
                         super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>.
                         _M_payload.
                         super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                         .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._520_8_);
              std::optional<cmCMakePresetsGraph::PackagePreset>::operator=
                        ((optional<cmCMakePresetsGraph::PackagePreset> *)
                         ((long)&presetPair_3.Unexpanded.VendorName.field_2 + 8));
              pVar15 = std::
                       map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>>
                       ::
                       emplace<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>&>
                                 ((map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>>
                                   *)&this->PackagePresets,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(presetPair_3.Expanded.
                                      super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>
                                      ._520_8_ + 8),
                                  (PresetPair<cmCMakePresetsGraph::PackagePreset> *)local_1bc0);
              bVar1 = ((pVar15.second ^ 0xffU) & 1) != 0;
              if (bVar1) {
                this_local._4_4_ = DUPLICATE_PRESETS;
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&this->PackagePresetOrder,
                            (value_type *)
                            (presetPair_3.Expanded.
                             super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>.
                             _M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                             .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>.
                             _520_8_ + 8));
              }
              PresetPair<cmCMakePresetsGraph::PackagePreset>::~PresetPair
                        ((PresetPair<cmCMakePresetsGraph::PackagePreset> *)local_1bc0);
              if (bVar1) goto LAB_00208052;
              __gnu_cxx::
              __normal_iterator<cmCMakePresetsGraph::PackagePreset_*,_std::vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_>
              ::operator++(&__end1_4);
            }
            this_04 = &presets.PackagePresets.
                       super__Vector_base<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end1_5 = std::
                       vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                       ::begin((vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                                *)this_04);
            preset_4 = (WorkflowPreset *)
                       std::
                       vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                       ::end((vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                              *)this_04);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end1_5,
                                      (__normal_iterator<cmCMakePresetsGraph::WorkflowPreset_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_>
                                       *)&preset_4), bVar1) {
              presetPair_4.Expanded.
              super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._240_8_ =
                   __gnu_cxx::
                   __normal_iterator<cmCMakePresetsGraph::WorkflowPreset_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_>
                   ::operator*(&__end1_5);
              (((reference)
               presetPair_4.Expanded.
               super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>.
               super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._240_8_)->
              super_Preset).OriginFile = *file;
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) != 0) {
                this_local._4_4_ = INVALID_PRESET;
                goto LAB_00208052;
              }
              PresetPair<cmCMakePresetsGraph::WorkflowPreset>::PresetPair
                        ((PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)local_1df0);
              WorkflowPreset::operator=
                        ((WorkflowPreset *)local_1df0,
                         (WorkflowPreset *)
                         presetPair_4.Expanded.
                         super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>.
                         _M_payload.
                         super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>
                         .super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._240_8_)
              ;
              std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator=
                        ((optional<cmCMakePresetsGraph::WorkflowPreset> *)
                         &presetPair_4.Unexpanded.Steps.
                          super__Vector_base<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pVar16 = std::
                       map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>>
                       ::
                       emplace<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>&>
                                 ((map<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>>
                                   *)&this->WorkflowPresets,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(presetPair_4.Expanded.
                                      super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>
                                      ._240_8_ + 8),
                                  (PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)local_1df0);
              includeFile.file = (File *)pVar16.first._M_node;
              bVar1 = ((pVar16.second ^ 0xffU) & 1) != 0;
              if (bVar1) {
                this_local._4_4_ = DUPLICATE_PRESETS;
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&this->WorkflowPresetOrder,
                            (value_type *)
                            (presetPair_4.Expanded.
                             super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>
                             .super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>.
                             _240_8_ + 8));
              }
              PresetPair<cmCMakePresetsGraph::WorkflowPreset>::~PresetPair
                        ((PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)local_1df0);
              if (bVar1) goto LAB_00208052;
              __gnu_cxx::
              __normal_iterator<cmCMakePresetsGraph::WorkflowPreset_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_>
              ::operator++(&__end1_5);
            }
            includeFile.inProgressFiles =
                 (vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  *)*file;
            this_05 = &presets.WorkflowPresets.
                       super__Vector_base<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __range1_6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this;
            includeFile.this = (cmCMakePresetsGraph *)inProgressFiles;
            __end1_6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)this_05);
            include.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_05);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end1_6,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&include.field_2 + 8)), bVar1) {
              pbVar11 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end1_6);
              std::__cxx11::string::string
                        ((string *)(directory.field_2._M_local_buf + 8),(string *)pbVar11);
              bVar1 = cmsys::SystemTools::FileIsFullPath((string *)((long)&directory.field_2 + 8));
              if (!bVar1) {
                cmsys::SystemTools::GetFilenamePath((string *)local_1e88,filename);
                cmAlphaNum::cmAlphaNum(&local_1ed8,(string *)local_1e88);
                cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&cmakePresetsFilename.field_2 + 8),'/');
                cmStrCat<std::__cxx11::string>
                          (&local_1ea8,&local_1ed8,
                           (cmAlphaNum *)((long)&cmakePresetsFilename.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&directory.field_2 + 8));
                std::__cxx11::string::operator=
                          ((string *)(directory.field_2._M_local_buf + 8),(string *)&local_1ea8);
                std::__cxx11::string::~string((string *)&local_1ea8);
                std::__cxx11::string::~string((string *)local_1e88);
              }
              RVar3 = ReadJSONFile::anon_class_24_3_d2e26b0a::operator()
                                ((anon_class_24_3_d2e26b0a *)&__range1_6,
                                 (string *)((long)&directory.field_2 + 8),rootType,Included,errMsg);
              if (RVar3 != READ_OK) {
                this_local._4_4_ = RVar3;
              }
              std::__cxx11::string::~string((string *)(directory.field_2._M_local_buf + 8));
              if (RVar3 != READ_OK) goto LAB_00208052;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end1_6);
            }
            if ((rootType == User) && (readReason == Root)) {
              GetFilename((string *)local_1f28,&this->SourceDir);
              bVar1 = cmsys::SystemTools::FileExists((string *)local_1f28);
              if ((bVar1) &&
                 (RVar3 = ReadJSONFile::anon_class_24_3_d2e26b0a::operator()
                                    ((anon_class_24_3_d2e26b0a *)&__range1_6,(string *)local_1f28,
                                     Project,Root,errMsg), RVar3 != READ_OK)) {
                bVar1 = true;
                this_local._4_4_ = RVar3;
              }
              else {
                bVar1 = false;
              }
              std::__cxx11::string::~string((string *)local_1f28);
              if (!bVar1) goto LAB_00208038;
            }
            else {
LAB_00208038:
              std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
              ::pop_back(inProgressFiles);
              this_local._4_4_ = READ_OK;
            }
LAB_00208052:
            std::
            unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>::
            ~unique_ptr(&local_4c0);
            RVar3 = this_local._4_4_;
          }
        }
        this_local._4_4_ = RVar3;
        anon_unknown.dwarf_15151e::RootPresets::~RootPresets((RootPresets *)&currentMinor);
        RVar3 = this_local._4_4_;
      }
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_3c8,filename);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_3f8,":\n");
    cmStrCat<std::__cxx11::string>(&local_398,&local_3c8,(cmAlphaNum *)local_3f8,errMsg);
    std::__cxx11::string::operator=((string *)errMsg,(string *)&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    this_local._4_4_ = JSON_PARSE_ERROR;
    RVar3 = this_local._4_4_;
  }
  this_local._4_4_ = RVar3;
  Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)local_378);
  Json::Value::~Value((Value *)&builder.settings_.limit_);
LAB_002080be:
  std::ifstream::~ifstream(&local_288);
  return this_local._4_4_;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult cmCMakePresetsGraph::ReadJSONFile(
  const std::string& filename, RootType rootType, ReadReason readReason,
  std::vector<File*>& inProgressFiles, File*& file, std::string& errMsg)
{
  ReadFileResult result;

  for (auto const& f : this->Files) {
    if (cmSystemTools::SameFile(filename, f->Filename)) {
      file = f.get();
      auto fileIt =
        std::find(inProgressFiles.begin(), inProgressFiles.end(), file);
      if (fileIt != inProgressFiles.end()) {
        return cmCMakePresetsGraph::ReadFileResult::CYCLIC_INCLUDE;
      }

      return cmCMakePresetsGraph::ReadFileResult::READ_OK;
    }
  }

  cmsys::ifstream fin(filename.c_str());
  if (!fin) {
    errMsg = cmStrCat(filename, ": Failed to read file\n", errMsg);
    return ReadFileResult::FILE_NOT_FOUND;
  }
  // If there's a BOM, toss it.
  cmsys::FStream::ReadBOM(fin);

  Json::Value root;
  Json::CharReaderBuilder builder;
  Json::CharReaderBuilder::strictMode(&builder.settings_);
  if (!Json::parseFromStream(builder, fin, &root, &errMsg)) {
    errMsg = cmStrCat(filename, ":\n", errMsg);
    return ReadFileResult::JSON_PARSE_ERROR;
  }

  int v = 0;
  if ((result = RootVersionHelper(v, &root)) != ReadFileResult::READ_OK) {
    return result;
  }
  if (v < MIN_VERSION || v > MAX_VERSION) {
    return ReadFileResult::UNRECOGNIZED_VERSION;
  }

  // Support for build and test presets added in version 2.
  if (v < 2 &&
      (root.isMember("buildPresets") || root.isMember("testPresets"))) {
    return ReadFileResult::BUILD_TEST_PRESETS_UNSUPPORTED;
  }

  // Support for package presets added in version 6.
  if (v < 6 && root.isMember("packagePresets")) {
    return ReadFileResult::PACKAGE_PRESETS_UNSUPPORTED;
  }

  // Support for workflow presets added in version 6.
  if (v < 6 && root.isMember("workflowPresets")) {
    return ReadFileResult::WORKFLOW_PRESETS_UNSUPPORTED;
  }

  // Support for include added in version 4.
  if (v < 4 && root.isMember("include")) {
    return ReadFileResult::INCLUDE_UNSUPPORTED;
  }

  RootPresets presets;
  if ((result = RootPresetsHelper(presets, &root)) !=
      ReadFileResult::READ_OK) {
    return result;
  }

  unsigned int currentMajor = cmVersion::GetMajorVersion();
  unsigned int currentMinor = cmVersion::GetMinorVersion();
  unsigned int currentPatch = cmVersion::GetPatchVersion();
  auto const& required = presets.CMakeMinimumRequired;
  if (required.Major > currentMajor ||
      (required.Major == currentMajor &&
       (required.Minor > currentMinor ||
        (required.Minor == currentMinor &&
         (required.Patch > currentPatch))))) {
    return ReadFileResult::UNRECOGNIZED_CMAKE_VERSION;
  }

  auto filePtr = cm::make_unique<File>();
  file = filePtr.get();
  this->Files.emplace_back(std::move(filePtr));
  inProgressFiles.emplace_back(file);
  file->Filename = filename;
  file->Version = v;
  file->ReachableFiles.insert(file);

  for (auto& preset : presets.ConfigurePresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      errMsg += R"(\n\t)";
      errMsg += filename;
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<ConfigurePreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->ConfigurePresets
           .emplace(std::make_pair(preset.Name, presetPair))
           .second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for installDir presets added in version 3.
    if (v < 3 && !preset.InstallDir.empty()) {
      return ReadFileResult::INSTALL_PREFIX_UNSUPPORTED;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    // Support for toolchainFile presets added in version 3.
    if (v < 3 && !preset.ToolchainFile.empty()) {
      return ReadFileResult::TOOLCHAIN_FILE_UNSUPPORTED;
    }

    this->ConfigurePresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.BuildPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      errMsg += R"(\n\t)";
      errMsg += filename;
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<BuildPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->BuildPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    this->BuildPresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.TestPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<TestPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->TestPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    // Support for TestOutputTruncation added in version 5.
    if (v < 5 && preset.Output && preset.Output->TestOutputTruncation) {
      return ReadFileResult::TEST_OUTPUT_TRUNCATION_UNSUPPORTED;
    }

    // Support for outputJUnitFile added in version 6.
    if (v < 6 && preset.Output && !preset.Output->OutputJUnitFile.empty()) {
      return ReadFileResult::CTEST_JUNIT_UNSUPPORTED;
    }

    this->TestPresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.PackagePresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<PackagePreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->PackagePresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3, but this requires version 5
    // already, so no action needed.

    this->PackagePresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.WorkflowPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<WorkflowPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->WorkflowPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3, but this requires version 6
    // already, so no action needed.

    this->WorkflowPresetOrder.push_back(preset.Name);
  }

  auto const includeFile = [this, &inProgressFiles, file](
                             const std::string& include, RootType rootType2,
                             ReadReason readReason2,
                             std::string& FailureMessage) -> ReadFileResult {
    ReadFileResult r;
    File* includedFile;
    if ((r = this->ReadJSONFile(include, rootType2, readReason2,
                                inProgressFiles, includedFile,
                                FailureMessage)) != ReadFileResult::READ_OK) {
      return r;
    }

    file->ReachableFiles.insert(includedFile->ReachableFiles.begin(),
                                includedFile->ReachableFiles.end());
    return ReadFileResult::READ_OK;
  };

  for (auto include : presets.Include) {
    if (!cmSystemTools::FileIsFullPath(include)) {
      auto directory = cmSystemTools::GetFilenamePath(filename);
      include = cmStrCat(directory, '/', include);
    }

    if ((result = includeFile(include, rootType, ReadReason::Included,
                              errMsg)) != ReadFileResult::READ_OK) {
      return result;
    }
  }

  if (rootType == RootType::User && readReason == ReadReason::Root) {
    auto cmakePresetsFilename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(cmakePresetsFilename)) {
      if ((result = includeFile(cmakePresetsFilename, RootType::Project,
                                ReadReason::Root, errMsg)) !=
          ReadFileResult::READ_OK) {
        return result;
      }
    }
  }

  inProgressFiles.pop_back();
  return ReadFileResult::READ_OK;
}